

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.h
# Opt level: O0

cmCommand * __thiscall
cmSetSourceFilesPropertiesCommand::Clone(cmSetSourceFilesPropertiesCommand *this)

{
  cmCommand *this_00;
  cmSetSourceFilesPropertiesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSetSourceFilesPropertiesCommand((cmSetSourceFilesPropertiesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmSetSourceFilesPropertiesCommand; }